

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O2

uint32_t __thiscall cab::passengers_at_node(cab *this,node_type node)

{
  pointer prVar1;
  road_network *prVar2;
  node_type nVar3;
  node_type q;
  bool bVar4;
  node_type nVar5;
  uint32_t uVar6;
  pointer prVar7;
  request r;
  uint32_t local_5c;
  request local_48;
  
  prVar7 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
           super__Vector_impl_data._M_start;
  prVar1 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_5c = 0;
  do {
    if (prVar7 == prVar1) {
      return local_5c;
    }
    local_48._src = prVar7->_src;
    local_48._dst = prVar7->_dst;
    local_48._2_2_ = *(undefined2 *)&prVar7->field_0x2;
    local_48._passengers = prVar7->_passengers;
    local_48._detours = prVar7->_detours;
    local_48._picked_up = prVar7->_picked_up;
    local_48._13_3_ = *(undefined3 *)&prVar7->field_0xd;
    prVar2 = this->_rnet;
    nVar5 = this->_position;
    nVar3 = request::dst(&local_48);
    q = request::src(&local_48);
    bVar4 = road_network::in_between(prVar2,nVar5,nVar3,q);
    if (bVar4) {
      prVar2 = this->_rnet;
      nVar5 = request::src(&local_48);
      nVar3 = request::dst(&local_48);
      bVar4 = road_network::in_between(prVar2,nVar5,nVar3,node);
      if (!bVar4) goto LAB_0015923d;
LAB_0015929f:
      uVar6 = request::passengers(&local_48);
      local_5c = local_5c + uVar6;
    }
    else {
LAB_0015923d:
      prVar2 = this->_rnet;
      nVar5 = request::src(&local_48);
      nVar3 = request::dst(&local_48);
      bVar4 = road_network::in_between(prVar2,nVar5,nVar3,this->_position);
      if (bVar4) {
        bVar4 = request::picked_up(&local_48);
        if (bVar4) {
          prVar2 = this->_rnet;
          nVar5 = this->_position;
          nVar3 = request::dst(&local_48);
          bVar4 = road_network::in_between(prVar2,nVar5,nVar3,node);
          if (bVar4) goto LAB_0015929f;
        }
      }
    }
    nVar5 = request::dst(&local_48);
    if (nVar5 == node) {
      uVar6 = request::passengers(&local_48);
      local_5c = local_5c - uVar6;
    }
    prVar7 = prVar7 + 1;
  } while( true );
}

Assistant:

std::uint32_t cab::passengers_at_node(node_type node)
{
    std::uint32_t passengers = 0;
    for(auto r : _requests)
    {
        // add to passengers either if r.src() -> node -> r.dst() and _position -> r.src() -> r.dst()
        // or r.src() -> _position -> r.dst() and cab has picked up passengers at position and _position -> node -> r.dst()
        if(_rnet->in_between(_position, r.dst(), r.src()) &&
                _rnet->in_between(r.src(), r.dst(), node))
        {
            passengers += r.passengers();
        }
        else if(_rnet->in_between(r.src(), r.dst(), _position) && r.picked_up() && _rnet->in_between(_position, r.dst(), node))
        { 
            passengers += r.passengers();
        }

        // if r.dst() == node it still gets counted above
        if(r.dst() == node)
        {
            passengers -= r.passengers();
        }
    }
    
    return passengers;
}